

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void VE4(uint8_t *dst,uint8_t *top)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  int i;
  uint8_t vals [4];
  uint8_t *top_local;
  uint8_t *dst_local;
  
  bVar1 = top[-1];
  bVar2 = *top;
  bVar3 = top[1];
  bVar4 = *top;
  bVar5 = top[1];
  bVar6 = top[2];
  bVar7 = top[1];
  bVar8 = top[2];
  bVar9 = top[3];
  bVar10 = top[2];
  bVar11 = top[3];
  bVar12 = top[4];
  for (i = 0; i < 4; i = i + 1) {
    *(uint *)(dst + (i << 5)) =
         CONCAT13((char)((int)((uint)bVar10 + (uint)bVar11 * 2 + (uint)bVar12 + 2) >> 2),
                  CONCAT12((char)((int)((uint)bVar7 + (uint)bVar8 * 2 + (uint)bVar9 + 2) >> 2),
                           CONCAT11((char)((int)((uint)bVar4 + (uint)bVar5 * 2 + (uint)bVar6 + 2) >>
                                          2),(char)((int)((uint)bVar1 + (uint)bVar2 * 2 +
                                                          (uint)bVar3 + 2) >> 2))));
  }
  return;
}

Assistant:

static void VE4(uint8_t* dst, const uint8_t* top) {    // vertical
  const uint8_t vals[4] = {
    AVG3(top[-1], top[0], top[1]),
    AVG3(top[ 0], top[1], top[2]),
    AVG3(top[ 1], top[2], top[3]),
    AVG3(top[ 2], top[3], top[4])
  };
  int i;
  for (i = 0; i < 4; ++i) {
    memcpy(dst + i * BPS, vals, 4);
  }
}